

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ParseField
          (ParserImpl *this,FieldDescriptor *field,Message *output)

{
  CppType CVar1;
  Reflection *pRVar2;
  undefined1 local_41;
  undefined1 local_21;
  bool suc;
  Message *output_local;
  FieldDescriptor *field_local;
  ParserImpl *this_local;
  
  CVar1 = FieldDescriptor::cpp_type(field);
  if (CVar1 == CPPTYPE_MESSAGE) {
    pRVar2 = Message::GetReflection(output);
    local_21 = ConsumeFieldMessage(this,output,pRVar2,field);
  }
  else {
    pRVar2 = Message::GetReflection(output);
    local_21 = ConsumeFieldValue(this,output,pRVar2,field);
  }
  local_41 = false;
  if (local_21 != false) {
    local_41 = LookingAtType(this,TYPE_END);
  }
  return local_41;
}

Assistant:

bool ParseField(const FieldDescriptor* field, Message* output) {
    bool suc;
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      suc = ConsumeFieldMessage(output, output->GetReflection(), field);
    } else {
      suc = ConsumeFieldValue(output, output->GetReflection(), field);
    }
    return suc && LookingAtType(io::Tokenizer::TYPE_END);
  }